

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZVec<int> *blocksize)

{
  long local_28;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBlockDiagonal_01667018;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01650620;
  (this->fStorage).fStore = (complex<float> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  local_28 = 0;
  TPZVec<long>::TPZVec(&this->fBlockPos,1,&local_28);
  (this->fBlockSize)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fBlockSize).fStore = (int *)0x0;
  (this->fBlockSize).fNElements = 0;
  (this->fBlockSize).fNAlloc = 0;
  Initialize(this,blocksize);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksize)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	Initialize(blocksize);
}